

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>,false>
          (Thread *this)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  Value VVar11;
  
  VVar11 = Pop(this);
  VVar11._8_8_ = VVar11._8_8_;
  auVar1._8_6_ = 0;
  auVar1._0_8_ = VVar11._8_8_;
  auVar1[0xe] = VVar11._15_1_;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = VVar11._8_8_;
  auVar2[0xc] = VVar11._14_1_;
  auVar2._13_2_ = auVar1._13_2_;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = VVar11._8_8_;
  auVar3._12_3_ = auVar2._12_3_;
  auVar4._8_2_ = 0;
  auVar4._0_8_ = VVar11._8_8_;
  auVar4[10] = VVar11._13_1_;
  auVar4._11_4_ = auVar3._11_4_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = VVar11._8_8_;
  auVar5._10_5_ = auVar4._10_5_;
  auVar6[8] = VVar11._12_1_;
  auVar6._0_8_ = VVar11._8_8_;
  auVar6._9_6_ = auVar5._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar6._8_7_;
  auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar9[0] = VVar11._11_1_;
  auVar9._9_6_ = 0;
  auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
  auVar10[0] = VVar11._10_1_;
  auVar10._11_4_ = 0;
  auVar7._3_12_ = SUB1512(auVar10 << 0x20,3);
  auVar7[2] = VVar11._9_1_;
  auVar7[1] = 0;
  auVar7[0] = VVar11._8_1_;
  VVar11._0_8_ = auVar7._0_8_;
  VVar11._8_7_ = auVar6._8_7_;
  VVar11.v128_.v[0xf] = 0;
  Push(this,VVar11);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}